

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O2

void __thiscall DIS::ServiceRequestPdu::unmarshal(ServiceRequestPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  SupplyQuantity x;
  SupplyQuantity SStack_48;
  
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_requestingEntityID,dataStream);
  EntityID::unmarshal(&this->_servicingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_serviceTypeRequested);
  DataStream::operator>>(dataStream,&this->_numberOfSupplyTypes);
  DataStream::operator>>(dataStream,&this->_serviceRequestPadding);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  for (uVar1 = 0; uVar1 < this->_numberOfSupplyTypes; uVar1 = uVar1 + 1) {
    SupplyQuantity::SupplyQuantity(&SStack_48);
    SupplyQuantity::unmarshal(&SStack_48,dataStream);
    std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::push_back
              (&this->_supplies,&SStack_48);
    SupplyQuantity::~SupplyQuantity(&SStack_48);
  }
  return;
}

Assistant:

void ServiceRequestPdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _requestingEntityID.unmarshal(dataStream);
    _servicingEntityID.unmarshal(dataStream);
    dataStream >> _serviceTypeRequested;
    dataStream >> _numberOfSupplyTypes;
    dataStream >> _serviceRequestPadding;

     _supplies.clear();
     for(size_t idx = 0; idx < _numberOfSupplyTypes; idx++)
     {
        SupplyQuantity x;
        x.unmarshal(dataStream);
        _supplies.push_back(x);
     }
}